

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O2

bool ddd::utils::match(char *lhs,char *rhs,uint32_t *len)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = 1;
  while( true ) {
    uVar2 = uVar1 - 1;
    *len = uVar2;
    if (lhs[uVar2] == '\0') {
      if (rhs[uVar2] != '\0') {
        return false;
      }
      *len = uVar1;
      return true;
    }
    if (lhs[uVar2] != rhs[uVar2]) break;
    uVar1 = uVar1 + 1;
  }
  return false;
}

Assistant:

inline bool match(const char* lhs, const char* rhs, uint32_t& len) {
  len = 0;
  while (lhs[len] != '\0') {
    if (lhs[len] != rhs[len]) {
      return false;
    }
    ++len;
  }
  if (rhs[len] != '\0') {
    return false;
  }
  ++len;
  return true;
}